

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall
ON_FontGlyphCache::SetFontMetrics(ON_FontGlyphCache *this,ON_FontMetrics *font_unit_metrics)

{
  int iVar1;
  double local_70;
  double local_68;
  ON_FontMetrics local_58;
  ON_FontMetrics *local_18;
  ON_FontMetrics *font_unit_metrics_local;
  ON_FontGlyphCache *this_local;
  
  local_18 = font_unit_metrics;
  font_unit_metrics_local = (ON_FontMetrics *)this;
  memcpy(&this->m_font_unit_metrics,font_unit_metrics,0x40);
  iVar1 = ON_FontMetrics::UPM(local_18);
  if (iVar1 < 1) {
    local_68 = 0.0;
  }
  else {
    iVar1 = ON_FontMetrics::UPM(local_18);
    local_68 = (double)iVar1 / 256.0;
  }
  this->m_normalized_to_font_unit_scale = local_68;
  if (this->m_normalized_to_font_unit_scale <= 0.0) {
    local_70 = 0.0;
  }
  else {
    iVar1 = ON_FontMetrics::UPM(local_18);
    local_70 = 256.0 / (double)iVar1;
  }
  this->m_font_unit_to_normalized_scale = local_70;
  if ((this->m_font_unit_to_normalized_scale <= 0.0) ||
     ((this->m_font_unit_to_normalized_scale == 1.0 && (!NAN(this->m_font_unit_to_normalized_scale))
      ))) {
    memcpy(&local_58,&this->m_font_unit_metrics,0x40);
  }
  else {
    ON_FontMetrics::Scale
              (&local_58,&this->m_font_unit_metrics,this->m_font_unit_to_normalized_scale);
  }
  memcpy(&this->m_normalized_metrics,&local_58,0x40);
  return;
}

Assistant:

void ON_FontGlyphCache::SetFontMetrics(
  const ON_FontMetrics& font_unit_metrics
)
{
  m_font_unit_metrics = font_unit_metrics;

  m_normalized_to_font_unit_scale 
    = font_unit_metrics.UPM() > 0
    ? (((double)font_unit_metrics.UPM()) / ((double)ON_Font::Constants::AnnotationFontCellHeight))
    : 0.0;
  m_font_unit_to_normalized_scale
    = m_normalized_to_font_unit_scale > 0.0
    ? (((double)ON_Font::Constants::AnnotationFontCellHeight) / ((double)font_unit_metrics.UPM()))
    : 0.0;

  m_normalized_metrics
    = (m_font_unit_to_normalized_scale > 0.0 && 1.0 != m_font_unit_to_normalized_scale)
    ? ON_FontMetrics::Scale(m_font_unit_metrics, m_font_unit_to_normalized_scale)
    : m_font_unit_metrics;
}